

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O1

void __thiscall Imf_3_2::DeepScanLineInputFile::Data::~Data(Data *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  LineBuffer *pLVar2;
  uint *puVar3;
  pointer pcVar4;
  char *pcVar5;
  bool *pbVar6;
  pointer puVar7;
  pointer ppLVar8;
  pointer ppIVar9;
  ulong uVar10;
  
  ppLVar8 = (this->lineBuffers).
            super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->lineBuffers).
      super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppLVar8) {
    uVar10 = 0;
    do {
      pLVar2 = ppLVar8[uVar10];
      if (pLVar2 != (LineBuffer *)0x0) {
        if (pLVar2->compressor != (Compressor *)0x0) {
          (*pLVar2->compressor->_vptr_Compressor[1])();
        }
        IlmThread_3_2::Semaphore::~Semaphore(&pLVar2->_sem);
        puVar3 = (pLVar2->_tempCountBuffer)._data;
        if (puVar3 != (uint *)0x0) {
          operator_delete__(puVar3);
        }
        pcVar4 = (pLVar2->exception)._M_dataplus._M_p;
        paVar1 = &(pLVar2->exception).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 != paVar1) {
          operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
        }
        operator_delete(pLVar2,0xa0);
      }
      uVar10 = uVar10 + 1;
      ppLVar8 = (this->lineBuffers).
                super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(this->lineBuffers).
                                    super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar8 >> 3)
            );
  }
  ppIVar9 = (this->slices).
            super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->slices).
      super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppIVar9) {
    uVar10 = 0;
    do {
      if (ppIVar9[uVar10] != (InSliceInfo *)0x0) {
        operator_delete(ppIVar9[uVar10],0x48);
      }
      uVar10 = uVar10 + 1;
      ppIVar9 = (this->slices).
                super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(this->slices).
                                    super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar9 >> 3)
            );
  }
  if (this->sampleCountTableComp != (Compressor *)0x0) {
    (*this->sampleCountTableComp->_vptr_Compressor[1])();
  }
  if ((this->multiPartBackwardSupport == true) && (this->multiPartFile != (MultiPartInputFile *)0x0)
     ) {
    (*(this->multiPartFile->super_GenericInputFile)._vptr_GenericInputFile[1])();
  }
  pcVar5 = (this->sampleCountTableBuffer)._data;
  if (pcVar5 != (char *)0x0) {
    operator_delete__(pcVar5);
  }
  pbVar6 = (this->gotSampleCount)._data;
  if (pbVar6 != (bool *)0x0) {
    operator_delete__(pbVar6);
  }
  puVar3 = (this->lineSampleCount)._data;
  if (puVar3 != (uint *)0x0) {
    operator_delete__(puVar3);
  }
  puVar3 = (this->sampleCount)._data;
  if (puVar3 != (uint *)0x0) {
    operator_delete__(puVar3);
  }
  ppLVar8 = (this->lineBuffers).
            super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppLVar8 != (pointer)0x0) {
    operator_delete(ppLVar8,(long)(this->lineBuffers).
                                  super__Vector_base<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppLVar8
                   );
  }
  ppIVar9 = (this->slices).
            super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppIVar9 != (pointer)0x0) {
    operator_delete(ppIVar9,(long)(this->slices).
                                  super__Vector_base<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppIVar9
                   );
  }
  puVar7 = (this->offsetInLineBuffer).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar7 != (pointer)0x0) {
    operator_delete(puVar7,(long)(this->offsetInLineBuffer).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar7);
  }
  puVar7 = (this->bytesPerLine).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar7 != (pointer)0x0) {
    operator_delete(puVar7,(long)(this->bytesPerLine).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar7);
  }
  puVar7 = (this->lineOffsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar7 != (pointer)0x0) {
    operator_delete(puVar7,(long)(this->lineOffsets).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar7);
  }
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::DeepSlice>_>_>
               *)&this->frameBuffer);
  Header::~Header(&this->header);
  return;
}

Assistant:

DeepScanLineInputFile::Data::~Data ()
{
    for (size_t i = 0; i < lineBuffers.size (); i++)
        if (lineBuffers[i] != 0) delete lineBuffers[i];

    for (size_t i = 0; i < slices.size (); i++)
        delete slices[i];

    if (sampleCountTableComp != 0) delete sampleCountTableComp;

    if (multiPartBackwardSupport) delete multiPartFile;
}